

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeData(BtCursor *pCur,u32 offset,u32 amt,void *pBuf)

{
  long in_RDI;
  int rc;
  int in_stack_00000034;
  uchar *in_stack_00000038;
  u32 in_stack_00000040;
  u32 in_stack_00000044;
  BtCursor *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if (*(char *)(in_RDI + 0x6d) == '\0') {
    local_4 = 4;
  }
  else {
    if (*(byte *)(in_RDI + 0x6d) < 3) {
      local_4 = 0;
    }
    else {
      local_4 = btreeRestoreCursorPosition
                          ((BtCursor *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                          );
    }
    if (local_4 == 0) {
      local_4 = accessPayload(in_stack_00000048,in_stack_00000044,in_stack_00000040,
                              in_stack_00000038,in_stack_00000034);
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeData(BtCursor *pCur, u32 offset, u32 amt, void *pBuf){
  int rc;

#ifndef SQLITE_OMIT_INCRBLOB
  if ( pCur->eState==CURSOR_INVALID ){
    return SQLITE_ABORT;
  }
#endif

  assert( cursorHoldsMutex(pCur) );
  rc = restoreCursorPosition(pCur);
  if( rc==SQLITE_OK ){
    assert( pCur->eState==CURSOR_VALID );
    assert( pCur->iPage>=0 && pCur->apPage[pCur->iPage] );
    assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
    rc = accessPayload(pCur, offset, amt, pBuf, 0);
  }
  return rc;
}